

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Own<capnp::compiler::NodeTranslator::BrandScope> __thiscall
capnp::compiler::NodeTranslator::BrandScope::pop(BrandScope *this,uint64_t newLeafId)

{
  Refcounted *refcounted;
  BrandScope *in_RDX;
  _func_int **pp_Var1;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar2;
  unsigned_long local_10;
  
  do {
    pp_Var1 = (_func_int **)newLeafId;
    if ((BrandScope *)pp_Var1[5] == in_RDX) {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var1;
      *(_func_int ***)&(this->super_Refcounted).refcount = pp_Var1;
      goto LAB_0021d921;
    }
    newLeafId = (uint64_t)pp_Var1[4];
  } while ((_func_int **)pp_Var1[4] != (_func_int **)0x0);
  OVar2 = kj::
          refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
                    ((kj *)this,(ErrorReporter *)pp_Var1[2],&local_10);
  in_RDX = OVar2.ptr;
LAB_0021d921:
  OVar2.ptr = in_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<BrandScope> pop(uint64_t newLeafId) {
    if (leafId == newLeafId) {
      return kj::addRef(*this);
    }
    KJ_IF_MAYBE(p, parent) {
      return (*p)->pop(newLeafId);
    } else {
      // Looks like we're moving into a whole top-level scope.
      return kj::refcounted<BrandScope>(errorReporter, newLeafId);
    }